

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

int archive_read_open1(archive *_a)

{
  long lVar1;
  undefined8 *puVar2;
  archive_read_filter *paVar3;
  code *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  archive_read_filter *paVar8;
  void *pvVar9;
  archive_string_conv **ppaVar10;
  uint uVar11;
  archive_read_filter *paVar12;
  char *fmt;
  long lVar13;
  archive_read_filter *self;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  long local_38;
  
  iVar5 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar5 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  if (_a[1].compression_name == (char *)0x0) {
    archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
  }
  else {
    if ((*(code **)&_a[1].compression_code != (code *)0x0) &&
       (iVar5 = (**(code **)&_a[1].compression_code)
                          (_a,*(undefined8 *)(*(long *)&_a[1].current_codepage + 0x10)), iVar5 != 0)
       ) {
      if (_a[1].error_string.s == (char *)0x0) {
        return iVar5;
      }
      lVar17 = 0x10;
      for (uVar15 = 0; uVar15 < (uint)_a[1].error_string.buffer_length; uVar15 = uVar15 + 1) {
        (*(code *)_a[1].error_string.s)
                  (_a,*(undefined8 *)(*(long *)&_a[1].current_codepage + lVar17));
        lVar17 = lVar17 + 0x18;
      }
      return iVar5;
    }
    paVar8 = (archive_read_filter *)calloc(1,0xb0);
    if (paVar8 == (archive_read_filter *)0x0) {
      return -0x1e;
    }
    paVar8->archive = (archive_read *)_a;
    puVar2 = *(undefined8 **)&_a[1].current_codepage;
    paVar8->data = (void *)puVar2[2];
    paVar8->open = client_open_proxy;
    paVar8->read = client_read_proxy;
    paVar8->skip = client_skip_proxy;
    paVar8->seek = client_seek_proxy;
    paVar8->close = client_close_proxy;
    paVar8->sswitch = client_switch_proxy;
    paVar8->name = "none";
    *puVar2 = 0;
    self = (archive_read_filter *)_a[6].error_string.length;
    if ((self == (archive_read_filter *)0x0) ||
       (paVar3 = self, (int)_a[6].error_string.buffer_length == 0)) {
      _a[6].error_string.length = (size_t)paVar8;
      iVar5 = 0;
      while( true ) {
        if (iVar5 == 0x19) {
          archive_set_error(_a,0x54,"Input requires too many filters for decoding");
          goto LAB_0032116b;
        }
        iVar7 = 0;
        lVar17 = 0;
        for (lVar13 = 0; (int)lVar13 != 0x300; lVar13 = lVar13 + 0x30) {
          pcVar4 = *(code **)((long)&_a[1].read_data_offset + lVar13);
          if (pcVar4 != (code *)0x0) {
            lVar1 = (long)&_a[1].sconv + lVar13;
            iVar6 = (*pcVar4)(lVar1,_a[6].error_string.length);
            if (iVar7 < iVar6) {
              lVar17 = lVar1;
              iVar7 = iVar6;
            }
          }
        }
        if (lVar17 == 0) break;
        pvVar9 = calloc(1,0xb0);
        if (pvVar9 == (void *)0x0) goto LAB_0032116b;
        *(long *)((long)pvVar9 + 8) = lVar17;
        *(archive **)((long)pvVar9 + 0x18) = _a;
        *(size_t *)((long)pvVar9 + 0x10) = _a[6].error_string.length;
        _a[6].error_string.length = (size_t)pvVar9;
        iVar7 = (**(code **)(lVar17 + 0x18))(pvVar9);
        iVar5 = iVar5 + 1;
        if (iVar7 != 0) {
LAB_00321163:
          __archive_read_free_filters((archive_read *)_a);
LAB_0032116b:
          _a->state = 0x8000;
          return -0x1e;
        }
      }
      __archive_read_filter_ahead((archive_read_filter *)_a[6].error_string.length,1,&local_38);
      if (-1 < local_38) {
        self = (archive_read_filter *)_a[6].error_string.length;
        _a->compression_name = self->name;
        _a->compression_code = self->code;
        goto LAB_00320f8e;
      }
      goto LAB_00321163;
    }
    do {
      paVar12 = paVar3;
      paVar3 = paVar12->upstream;
    } while (paVar3 != (archive_read_filter *)0x0);
    paVar12->upstream = paVar8;
LAB_00320f8e:
    if (_a[0xf].error_string.length != 0) {
LAB_00320f9c:
      _a->state = 2;
      client_switch_proxy(self,0);
      return 0;
    }
    iVar5 = -1;
    uVar16 = 0;
    uVar15 = 0xffffffff;
    ppaVar10 = &_a[6].sconv;
    while( true ) {
      _a[0xf].error_string.length = (size_t)ppaVar10;
      uVar14 = (uint)uVar15;
      if (uVar16 == 0x10) break;
      if (ppaVar10[2] != (archive_string_conv *)0x0) {
        iVar7 = (*(code *)ppaVar10[2])(_a);
        if (iVar7 == -0x1e) goto LAB_003211cf;
        if (*(long *)_a[6].error_string.length != 0) {
          __archive_read_seek((archive_read *)_a,0,0);
        }
        uVar11 = uVar16;
        if (-1 < (int)uVar14 && iVar7 <= iVar5) {
          uVar11 = uVar14;
          iVar7 = iVar5;
        }
        ppaVar10 = (archive_string_conv **)_a[0xf].error_string.length;
        uVar15 = (ulong)uVar11;
        iVar5 = iVar7;
      }
      uVar16 = uVar16 + 1;
      ppaVar10 = ppaVar10 + 0xb;
    }
    if ((int)uVar14 < 0) {
      fmt = "No formats registered";
    }
    else {
      if (0 < iVar5) {
        _a[0xf].error_string.length = (size_t)(&_a[6].sconv + uVar15 * 0xb);
        self = (archive_read_filter *)_a[6].error_string.length;
        goto LAB_00320f9c;
      }
      fmt = "Unrecognized archive format";
    }
    archive_set_error(_a,0x54,fmt);
LAB_003211cf:
    close_filters((archive_read *)_a);
  }
  _a->state = 0x8000;
  return -0x1e;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e = ARCHIVE_OK;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			if (a->client.closer) {
				for (i = 0; i < a->client.nodes; i++)
					(a->client.closer)(&a->archive,
					    a->client.dataset[i].data);
			}
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->open = client_open_proxy;
	filter->read = client_read_proxy;
	filter->skip = client_skip_proxy;
	filter->seek = client_seek_proxy;
	filter->close = client_close_proxy;
	filter->sswitch = client_switch_proxy;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}